

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O3

FrameOpResult __thiscall QRhiGles2::endOffscreenFrame(QRhiGles2 *this,EndFrameFlags flags)

{
  GLuint GVar1;
  Command *__src;
  undefined1 auVar2 [16];
  bool bVar3;
  quint64 nanoseconds;
  Command *__dest;
  long lVar4;
  ulong uVar5;
  int iVar6;
  FrameOpResult FVar7;
  long in_FS_OFFSET;
  undefined1 auVar8 [16];
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->ofr).active = false;
  GVar1 = (this->ofr).tsQueries[1];
  iVar6 = (this->ofr).cbWrapper.commands.p;
  if (iVar6 == (this->ofr).cbWrapper.commands.a) {
    uVar5 = (long)iVar6 + 0x400;
    (this->ofr).cbWrapper.commands.a = (int)uVar5;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar5;
    uVar5 = 0xffffffffffffffff;
    if (SUB168(auVar2 * ZEXT816(0x68),8) == 0) {
      uVar5 = SUB168(auVar2 * ZEXT816(0x68),0);
    }
    __dest = (Command *)operator_new__(uVar5);
    __src = (this->ofr).cbWrapper.commands.v;
    if (__src != (Command *)0x0) {
      memcpy(__dest,__src,(long)iVar6 * 0x68);
      operator_delete__(__src);
      iVar6 = (this->ofr).cbWrapper.commands.p;
    }
    (this->ofr).cbWrapper.commands.v = __dest;
  }
  else {
    __dest = (this->ofr).cbWrapper.commands.v;
  }
  (this->ofr).cbWrapper.commands.p = iVar6 + 1;
  __dest[iVar6].cmd = EndFrame;
  __dest[iVar6].args.beginFrame.timestampQuery = GVar1;
  bVar3 = ensureContext(this,(QSurface *)0x0);
  if (bVar3) {
    executeCommandBuffer(this,&(this->ofr).cbWrapper.super_QRhiCommandBuffer);
    (*(((this->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).functions
      [0x13])();
    FVar7 = FrameOpSuccess;
    if ((this->ofr).tsQueries[0] != 0) {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      (*this->glGetQueryObjectui64v)((this->ofr).tsQueries[1],0x8866,(quint64 *)&puStack_40);
      (*this->glGetQueryObjectui64v)((this->ofr).tsQueries[0],0x8866,(quint64 *)&local_48);
      lVar4 = (long)puStack_40 - (long)local_48;
      FVar7 = FrameOpSuccess;
      if (local_48 <= puStack_40) {
        auVar8._8_4_ = (int)((ulong)lVar4 >> 0x20);
        auVar8._0_8_ = lVar4;
        auVar8._12_4_ = 0x45300000;
        (this->ofr).cbWrapper.lastGpuTime =
             ((auVar8._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) / 1000000000.0;
      }
    }
  }
  else {
    FVar7 = (uint)this->contextLost * 2 + FrameOpError;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return FVar7;
  }
  __stack_chk_fail();
}

Assistant:

QRhi::FrameOpResult QRhiGles2::endOffscreenFrame(QRhi::EndFrameFlags flags)
{
    Q_UNUSED(flags);
    Q_ASSERT(ofr.active);
    ofr.active = false;

    addBoundaryCommand(&ofr.cbWrapper, QGles2CommandBuffer::Command::EndFrame, ofr.tsQueries[1]);

    if (!ensureContext())
        return contextLost ? QRhi::FrameOpDeviceLost : QRhi::FrameOpError;

    executeCommandBuffer(&ofr.cbWrapper);

    // Just as endFrame() does a flush when skipping the swapBuffers(), do it
    // here as well. This has the added benefit of playing nice when rendering
    // to a texture from a context and then consuming that texture from
    // another, sharing context.
    f->glFlush();

    if (ofr.tsQueries[0]) {
        quint64 timestamps[2];
        glGetQueryObjectui64v(ofr.tsQueries[1], GL_QUERY_RESULT, &timestamps[1]);
        glGetQueryObjectui64v(ofr.tsQueries[0], GL_QUERY_RESULT, &timestamps[0]);
        if (timestamps[1] >= timestamps[0]) {
            const quint64 nanoseconds = timestamps[1] - timestamps[0];
            ofr.cbWrapper.lastGpuTime = nanoseconds / 1000000000.0; // seconds
        }
    }

    return QRhi::FrameOpSuccess;
}